

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pinger_on_connect(uv_connect_t *req,int status)

{
  pinger_t *pinger_00;
  int iVar1;
  pinger_t *pinger;
  int status_local;
  uv_connect_t *req_local;
  
  pinger_00 = (pinger_t *)req->handle->data;
  pinger_on_connect_count = pinger_on_connect_count + 1;
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0x9c,"status == 0");
    abort();
  }
  iVar1 = uv_is_readable(req->handle);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0x9e,"1 == uv_is_readable(req->handle)");
    abort();
  }
  iVar1 = uv_is_writable(req->handle);
  if (iVar1 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0x9f,"1 == uv_is_writable(req->handle)");
    abort();
  }
  iVar1 = uv_is_closing((uv_handle_t *)req->handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xa0,"0 == uv_is_closing((uv_handle_t *) req->handle)");
    abort();
  }
  pinger_write_ping(pinger_00);
  uv_read_start(req->handle,alloc_cb,pinger_read_cb);
  return;
}

Assistant:

static void pinger_on_connect(uv_connect_t *req, int status) {
  pinger_t *pinger = (pinger_t*)req->handle->data;

  pinger_on_connect_count++;

  ASSERT(status == 0);

  ASSERT(1 == uv_is_readable(req->handle));
  ASSERT(1 == uv_is_writable(req->handle));
  ASSERT(0 == uv_is_closing((uv_handle_t *) req->handle));

  pinger_write_ping(pinger);

  uv_read_start((uv_stream_t*)(req->handle), alloc_cb, pinger_read_cb);
}